

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapStoreOptimization.cpp
# Opt level: O3

unique_ptr<wasm::Pass,_std::default_delete<wasm::Pass>_> __thiscall
wasm::anon_unknown_166::HeapStoreOptimization::create(HeapStoreOptimization *this)

{
  _func_int **__s;
  
  __s = (_func_int **)operator_new(0x408);
  memset(__s,0,0x408);
  __s[2] = (_func_int *)(__s + 4);
  __s[0xb] = (_func_int *)0x0;
  __s[0xc] = (_func_int *)0x0;
  __s[0x21] = (_func_int *)0x0;
  __s[0x22] = (_func_int *)0x0;
  __s[0x23] = (_func_int *)0x0;
  __s[0x24] = (_func_int *)0x0;
  __s[0x25] = (_func_int *)0x0;
  __s[0x26] = (_func_int *)0x0;
  __s[0x27] = (_func_int *)0x0;
  __s[0x28] = (_func_int *)0x0;
  __s[0x29] = (_func_int *)0x0;
  __s[0x2a] = (_func_int *)0x0;
  __s[0x2b] = (_func_int *)0x0;
  __s[0x2c] = (_func_int *)0x0;
  __s[0x2d] = (_func_int *)0x0;
  __s[0x32] = (_func_int *)(__s + 0x30);
  __s[0x33] = (_func_int *)(__s + 0x30);
  memset(__s + 0x34,0,0xb2);
  __s[0x4e] = (_func_int *)(__s + 0x4c);
  __s[0x4f] = (_func_int *)(__s + 0x4c);
  *__s = (_func_int *)&PTR__HeapStoreOptimization_01072d30;
  *(undefined1 *)(__s + 0x51) = 1;
  (this->
  super_WalkerPass<wasm::CFGWalker<wasm::(anonymous_namespace)::HeapStoreOptimization,_wasm::Visitor<wasm::(anonymous_namespace)::HeapStoreOptimization,_void>,_wasm::(anonymous_namespace)::Info>_>
  ).super_Pass._vptr_Pass = __s;
  return (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)
         (__uniq_ptr_data<wasm::Pass,_std::default_delete<wasm::Pass>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Pass> create() override {
    return std::make_unique<HeapStoreOptimization>();
  }